

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O0

void __thiscall
SemanticAnalyzerRun::onEnterAssignStatementAstNode
          (SemanticAnalyzerRun *this,AssignStatementAstNode *node)

{
  bool bVar1;
  element_type *this_00;
  element_type *variableName;
  shared_ptr<Token> *token;
  allocator<char> local_61;
  string local_60;
  undefined1 local_38 [8];
  optional<VariableDefinition> originalDeclare;
  AssignStatementAstNode *node_local;
  SemanticAnalyzerRun *this_local;
  
  originalDeclare.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
  super__Optional_payload<VariableDefinition,_true,_false,_false>.
  super__Optional_payload_base<VariableDefinition>._24_8_ = node;
  this_00 = std::__shared_ptr_access<Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Scope,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &this->currentScope);
  variableName = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            (originalDeclare.super__Optional_base<VariableDefinition,_false,_false>.
                             _M_payload.
                             super__Optional_payload<VariableDefinition,_true,_false,_false>.
                             super__Optional_payload_base<VariableDefinition>._24_8_ + 8));
  Scope::find((optional<VariableDefinition> *)local_38,this_00,&variableName->value,false);
  bVar1 = std::operator==(local_38);
  if (bVar1) {
    token = (shared_ptr<Token> *)
            (originalDeclare.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
             super__Optional_payload<VariableDefinition,_true,_false,_false>.
             super__Optional_payload_base<VariableDefinition>._24_8_ + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"No local declaration found for identifier.",&local_61);
    reportError(this,token,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  std::optional<VariableDefinition>::~optional((optional<VariableDefinition> *)local_38);
  return;
}

Assistant:

void onEnterAssignStatementAstNode(AssignStatementAstNode* node) noexcept override {
    auto originalDeclare = this->currentScope->find(node->identifier->value, false);
    if (originalDeclare == std::nullopt) {
      this->reportError(node->identifier, "No local declaration found for identifier.");
    }
  }